

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O1

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::ConstantManager::GetOperandConstants
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,ConstantManager *this,Instruction *inst)

{
  pointer *pppCVar1;
  uint **ppuVar2;
  iterator __position;
  Operand *pOVar3;
  uint **ppuVar4;
  uint uVar5;
  uint32_t index;
  Constant *constant;
  Constant *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar5 = (uint)inst->has_result_id_;
  }
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::reserve(__return_storage_ptr__,
            (ulong)((int)((ulong)((long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555 - uVar5));
  uVar5 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar5 = (uint)inst->has_result_id_;
  }
  if (uVar5 != (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    index = 0;
    do {
      pOVar3 = Instruction::GetInOperand(inst,index);
      if (pOVar3->type == SPV_OPERAND_TYPE_ID) {
        ppuVar2 = (uint **)(pOVar3->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar4 = &(pOVar3->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar4 = ppuVar2;
        }
        local_30 = FindDeclaredConstant(this,**ppuVar4);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
          ::_M_realloc_insert<spvtools::opt::analysis::Constant_const*const&>
                    ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                      *)__return_storage_ptr__,__position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          pppCVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
      else {
        local_30 = (Constant *)0x0;
        std::
        vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
        ::emplace_back<spvtools::opt::analysis::Constant_const*>
                  ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                    *)__return_storage_ptr__,&local_30);
      }
      index = index + 1;
      uVar5 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar5 = (uint)inst->has_result_id_;
      }
    } while (index < (int)((ulong)((long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Constant*> ConstantManager::GetOperandConstants(
    const Instruction* inst) const {
  std::vector<const Constant*> constants;
  constants.reserve(inst->NumInOperands());
  for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      constants.push_back(nullptr);
    } else {
      uint32_t id = operand->words[0];
      const analysis::Constant* constant = FindDeclaredConstant(id);
      constants.push_back(constant);
    }
  }
  return constants;
}